

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_resetCCtx_internal
                 (ZSTD_CCtx *zc,ZSTD_CCtx_params params,U64 pledgedSrcSize,
                 ZSTD_compResetPolicy_e crp,ZSTD_buffered_policy_e zbuff)

{
  undefined4 uVar1;
  U32 UVar2;
  ldmParams_t params_00;
  ZSTD_compressionParameters cParams;
  undefined1 auVar3 [20];
  ZSTD_window_t w;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined4 uVar6;
  undefined1 auVar7 [112];
  uint uVar8;
  int iVar9;
  size_t sVar10;
  U64 UVar11;
  ulong size;
  size_t sVar12;
  size_t sVar13;
  size_t sVar14;
  size_t sVar15;
  size_t sVar16;
  size_t sVar17;
  size_t sVar18;
  size_t sVar19;
  size_t sVar20;
  ulong additionalNeededSpace;
  ZSTD_compressedBlockState_t *pZVar21;
  U32 *pUVar22;
  BYTE *pBVar23;
  size_t bytes;
  seqDef *psVar24;
  long lVar25;
  ldmEntry_t *plVar26;
  rawSeq *prVar27;
  byte bVar28;
  ZSTD_cwksp *ws_00;
  undefined4 in_stack_fffffffffffffe24;
  ZSTD_strategy in_stack_fffffffffffffe28;
  undefined4 uVar29;
  U32 in_stack_fffffffffffffe2c;
  undefined4 uVar30;
  size_t local_1d0;
  size_t local_1c8;
  size_t local_1c0;
  ulong local_1a8;
  U64 local_1a0;
  ulong local_198;
  U64 local_190;
  size_t ldmHSize;
  size_t err_code_1;
  size_t ldmBucketSize;
  size_t err_code;
  int workspaceWasteful;
  int workspaceTooSmall;
  size_t neededSpace;
  size_t ldmSeqSpace;
  size_t ldmSpace;
  size_t bufferSpace;
  size_t blockStateSpace;
  size_t entropySpace;
  size_t cctxSpace;
  ZSTD_indexResetPolicy_e local_b4;
  ZSTD_indexResetPolicy_e needsIndexReset;
  size_t maxNbLdmSeq;
  size_t matchStateSize;
  size_t buffInSize;
  size_t buffOutSize;
  size_t tokenSpace;
  size_t maxNbSeq;
  U32 divider;
  size_t blockSize;
  size_t windowSize;
  ZSTD_cwksp *ws;
  ZSTD_buffered_policy_e zbuff_local;
  ZSTD_compResetPolicy_e crp_local;
  U64 pledgedSrcSize_local;
  ZSTD_CCtx *zc_local;
  
  ws_00 = &zc->workspace;
  auVar3 = params.cParams._8_20_;
  cParams.targetLength = in_stack_fffffffffffffe24;
  cParams.windowLog = auVar3._0_4_;
  cParams.chainLog = auVar3._4_4_;
  cParams.hashLog = auVar3._8_4_;
  cParams.searchLog = auVar3._12_4_;
  cParams.minMatch = auVar3._16_4_;
  cParams.strategy = in_stack_fffffffffffffe28;
  sVar10 = ZSTD_checkCParams(cParams);
  uVar8 = ZSTD_isError(sVar10);
  if (uVar8 != 0) {
    __assert_fail("!ZSTD_isError(ZSTD_checkCParams(params.cParams))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x2fc8,
                  "size_t ZSTD_resetCCtx_internal(ZSTD_CCtx *, ZSTD_CCtx_params, const U64, const ZSTD_compResetPolicy_e, const ZSTD_buffered_policy_e)"
                 );
  }
  zc->isFirstBlock = 1;
  if (params.ldmParams.enableLdm != 0) {
    ZSTD_ldm_adjustParameters(&params.ldmParams,&params.cParams);
    if (params.ldmParams.hashLog < params.ldmParams.bucketSizeLog) {
      __assert_fail("params.ldmParams.hashLog >= params.ldmParams.bucketSizeLog",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x2fcf,
                    "size_t ZSTD_resetCCtx_internal(ZSTD_CCtx *, ZSTD_CCtx_params, const U64, const ZSTD_compResetPolicy_e, const ZSTD_buffered_policy_e)"
                   );
    }
    if (0x1f < params.ldmParams.hashRateLog) {
      __assert_fail("params.ldmParams.hashRateLog < 32",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x2fd0,
                    "size_t ZSTD_resetCCtx_internal(ZSTD_CCtx *, ZSTD_CCtx_params, const U64, const ZSTD_compResetPolicy_e, const ZSTD_buffered_policy_e)"
                   );
    }
    UVar11 = ZSTD_rollingHash_primePower(params.ldmParams.minMatchLength);
    (zc->ldmState).hashPower = UVar11;
  }
  bVar28 = (byte)params.cParams.windowLog;
  local_190 = pledgedSrcSize;
  if ((ulong)(1L << (bVar28 & 0x3f)) < pledgedSrcSize) {
    local_190 = 1L << (bVar28 & 0x3f);
  }
  if (local_190 == 0) {
    local_198 = 1;
  }
  else {
    local_1a0 = pledgedSrcSize;
    if ((ulong)(1L << (bVar28 & 0x3f)) < pledgedSrcSize) {
      local_1a0 = 1L << (bVar28 & 0x3f);
    }
    local_198 = local_1a0;
  }
  if (local_198 < 0x20001) {
    local_1a8 = local_198;
  }
  else {
    local_1a8 = 0x20000;
  }
  uVar8 = 4;
  if (params.cParams.minMatch == 3) {
    uVar8 = 3;
  }
  size = local_1a8 / uVar8;
  sVar10 = ZSTD_cwksp_alloc_size(local_1a8 + 0x20);
  sVar12 = ZSTD_cwksp_alloc_size(size << 3);
  sVar13 = ZSTD_cwksp_alloc_size(size);
  if (zbuff == ZSTDb_buffered) {
    local_1c0 = ZSTD_compressBound(local_1a8);
    local_1c0 = local_1c0 + 1;
    local_1c8 = local_198 + local_1a8;
  }
  else {
    local_1c0 = 0;
    local_1c8 = 0;
  }
  sVar14 = ZSTD_sizeof_matchState(&params.cParams,1);
  sVar15 = ZSTD_ldm_getMaxNbSeq(params.ldmParams,local_1a8);
  local_b4 = (ZSTD_indexResetPolicy_e)(zc->initialized == 0);
  uVar1 = (zc->blockState).matchState.window.dictLimit;
  UVar2 = (zc->blockState).matchState.window.lowLimit;
  uVar4 = (zc->blockState).matchState.window.base;
  uVar5 = (zc->blockState).matchState.window.dictBase;
  uVar6 = (zc->blockState).matchState.window.dictLimit;
  w.dictBase._0_4_ = uVar6;
  w.base = (BYTE *)uVar5;
  w.nextSrc = (BYTE *)uVar4;
  w.dictBase._4_4_ = UVar2;
  w.dictLimit = in_stack_fffffffffffffe28;
  w.lowLimit = in_stack_fffffffffffffe2c;
  iVar9 = ZSTD_indexTooCloseToMax(w);
  if (iVar9 != 0) {
    local_b4 = ZSTDirp_reset;
  }
  ZSTD_cwksp_bump_oversized_duration(ws_00,0);
  if (zc->staticSize == 0) {
    local_1d0 = 0;
  }
  else {
    local_1d0 = ZSTD_cwksp_alloc_size(0x488);
  }
  sVar16 = ZSTD_cwksp_alloc_size(0x1800);
  sVar17 = ZSTD_cwksp_alloc_size(0x11f0);
  sVar18 = ZSTD_cwksp_alloc_size(local_1c8);
  uVar29 = (undefined4)sVar18;
  uVar30 = (undefined4)(sVar18 >> 0x20);
  sVar18 = ZSTD_cwksp_alloc_size(local_1c0);
  auVar7 = (undefined1  [112])params._32_112_;
  params_00.hashRateLog = uVar1;
  params_00.enableLdm = params.ldmParams.bucketSizeLog;
  params_00.hashLog = params.ldmParams.minMatchLength;
  params_00.bucketSizeLog = params.ldmParams.hashRateLog;
  params_00.minMatchLength = params.ldmParams.windowLog;
  params_00.windowLog = UVar2;
  params._32_112_ = auVar7;
  sVar19 = ZSTD_ldm_getTableSize(params_00);
  sVar20 = ZSTD_cwksp_alloc_size(sVar15 * 0xc);
  additionalNeededSpace =
       local_1d0 + sVar16 + sVar17 * 2 + sVar19 + sVar20 + sVar14 + sVar10 + sVar12 + sVar13 * 3 +
       CONCAT44(uVar30,uVar29) + sVar18;
  sVar10 = ZSTD_cwksp_sizeof(ws_00);
  iVar9 = ZSTD_cwksp_check_wasteful(ws_00,additionalNeededSpace);
  if ((sVar10 < additionalNeededSpace) || (iVar9 != 0)) {
    if (zc->staticSize != 0) {
      return 0xffffffffffffffc0;
    }
    local_b4 = ZSTDirp_reset;
    ZSTD_cwksp_free(ws_00,zc->customMem);
    sVar10 = ZSTD_cwksp_create(ws_00,additionalNeededSpace,zc->customMem);
    uVar8 = ERR_isError(sVar10);
    if (uVar8 != 0) {
      return sVar10;
    }
    iVar9 = ZSTD_cwksp_check_available(ws_00,0x23e0);
    if (iVar9 == 0) {
      __assert_fail("ZSTD_cwksp_check_available(ws, 2 * sizeof(ZSTD_compressedBlockState_t))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x3011,
                    "size_t ZSTD_resetCCtx_internal(ZSTD_CCtx *, ZSTD_CCtx_params, const U64, const ZSTD_compResetPolicy_e, const ZSTD_buffered_policy_e)"
                   );
    }
    pZVar21 = (ZSTD_compressedBlockState_t *)ZSTD_cwksp_reserve_object(ws_00,0x11f0);
    (zc->blockState).prevCBlock = pZVar21;
    if ((zc->blockState).prevCBlock == (ZSTD_compressedBlockState_t *)0x0) {
      return 0xffffffffffffffc0;
    }
    pZVar21 = (ZSTD_compressedBlockState_t *)ZSTD_cwksp_reserve_object(ws_00,0x11f0);
    (zc->blockState).nextCBlock = pZVar21;
    if ((zc->blockState).nextCBlock == (ZSTD_compressedBlockState_t *)0x0) {
      return 0xffffffffffffffc0;
    }
    pUVar22 = (U32 *)ZSTD_cwksp_reserve_object(ws_00,0x1800);
    zc->entropyWorkspace = pUVar22;
    if ((zc->blockState).nextCBlock == (ZSTD_compressedBlockState_t *)0x0) {
      return 0xffffffffffffffc0;
    }
  }
  ZSTD_cwksp_clear(ws_00);
  memcpy(&zc->appliedParams,&params,0x90);
  (zc->blockState).matchState.cParams.windowLog = params.cParams.windowLog;
  (zc->blockState).matchState.cParams.chainLog = params.cParams.chainLog;
  (zc->blockState).matchState.cParams.hashLog = params.cParams.hashLog;
  (zc->blockState).matchState.cParams.searchLog = params.cParams.searchLog;
  (zc->blockState).matchState.cParams.minMatch = params.cParams.minMatch;
  (zc->blockState).matchState.cParams.targetLength = params.cParams.targetLength;
  (zc->blockState).matchState.cParams.strategy = params.cParams.strategy;
  zc->pledgedSrcSizePlusOne = pledgedSrcSize + 1;
  zc->consumedSrcSize = 0;
  zc->producedCSize = 0;
  if (pledgedSrcSize == 0xffffffffffffffff) {
    (zc->appliedParams).fParams.contentSizeFlag = 0;
  }
  zc->blockSize = local_1a8;
  ZSTD_XXH64_reset(&zc->xxhState,0);
  zc->stage = ZSTDcs_init;
  zc->dictID = 0;
  ZSTD_reset_compressedBlockState((zc->blockState).prevCBlock);
  pBVar23 = ZSTD_cwksp_reserve_buffer(ws_00,local_1a8 + 0x20);
  (zc->seqStore).litStart = pBVar23;
  (zc->seqStore).maxNbLit = local_1a8;
  zc->inBuffSize = local_1c8;
  pBVar23 = ZSTD_cwksp_reserve_buffer(ws_00,local_1c8);
  zc->inBuff = (char *)pBVar23;
  zc->outBuffSize = local_1c0;
  pBVar23 = ZSTD_cwksp_reserve_buffer(ws_00,local_1c0);
  zc->outBuff = (char *)pBVar23;
  if (params.ldmParams.enableLdm != 0) {
    bytes = 1L << ((char)params.ldmParams.hashLog - (char)params.ldmParams.bucketSizeLog & 0x3fU);
    pBVar23 = ZSTD_cwksp_reserve_buffer(ws_00,bytes);
    (zc->ldmState).bucketOffsets = pBVar23;
    memset((zc->ldmState).bucketOffsets,0,bytes);
  }
  ZSTD_referenceExternalSequences(zc,(rawSeq *)0x0,0);
  (zc->seqStore).maxNbSeq = size;
  pBVar23 = ZSTD_cwksp_reserve_buffer(ws_00,size);
  (zc->seqStore).llCode = pBVar23;
  pBVar23 = ZSTD_cwksp_reserve_buffer(ws_00,size);
  (zc->seqStore).mlCode = pBVar23;
  pBVar23 = ZSTD_cwksp_reserve_buffer(ws_00,size);
  (zc->seqStore).ofCode = pBVar23;
  psVar24 = (seqDef *)ZSTD_cwksp_reserve_aligned(ws_00,size << 3);
  (zc->seqStore).sequencesStart = psVar24;
  zc_local = (ZSTD_CCtx *)
             ZSTD_reset_matchState
                       (&(zc->blockState).matchState,ws_00,&params.cParams,crp,local_b4,
                        ZSTD_resetTarget_CCtx);
  uVar8 = ERR_isError((size_t)zc_local);
  if (uVar8 == 0) {
    if (params.ldmParams.enableLdm != 0) {
      lVar25 = 1L << ((byte)params.ldmParams.hashLog & 0x3f);
      plVar26 = (ldmEntry_t *)ZSTD_cwksp_reserve_aligned(ws_00,lVar25 << 3);
      (zc->ldmState).hashTable = plVar26;
      memset((zc->ldmState).hashTable,0,lVar25 << 3);
      prVar27 = (rawSeq *)ZSTD_cwksp_reserve_aligned(ws_00,sVar15 * 0xc);
      zc->ldmSequences = prVar27;
      zc->maxNbLdmSequences = sVar15;
      ZSTD_window_init(&(zc->ldmState).window);
      ZSTD_window_clear(&(zc->ldmState).window);
    }
    zc->initialized = 1;
    zc_local = (ZSTD_CCtx *)0x0;
  }
  return (size_t)zc_local;
}

Assistant:

static size_t ZSTD_resetCCtx_internal(ZSTD_CCtx* zc,
                                      ZSTD_CCtx_params params,
                                      U64 const pledgedSrcSize,
                                      ZSTD_compResetPolicy_e const crp,
                                      ZSTD_buffered_policy_e const zbuff)
{
    ZSTD_cwksp* const ws = &zc->workspace;
    DEBUGLOG(4, "ZSTD_resetCCtx_internal: pledgedSrcSize=%u, wlog=%u",
                (U32)pledgedSrcSize, params.cParams.windowLog);
    assert(!ZSTD_isError(ZSTD_checkCParams(params.cParams)));

    zc->isFirstBlock = 1;

    if (params.ldmParams.enableLdm) {
        /* Adjust long distance matching parameters */
        ZSTD_ldm_adjustParameters(&params.ldmParams, &params.cParams);
        assert(params.ldmParams.hashLog >= params.ldmParams.bucketSizeLog);
        assert(params.ldmParams.hashRateLog < 32);
        zc->ldmState.hashPower = ZSTD_rollingHash_primePower(params.ldmParams.minMatchLength);
    }

    {   size_t const windowSize = MAX(1, (size_t)MIN(((U64)1 << params.cParams.windowLog), pledgedSrcSize));
        size_t const blockSize = MIN(ZSTD_BLOCKSIZE_MAX, windowSize);
        U32    const divider = (params.cParams.minMatch==3) ? 3 : 4;
        size_t const maxNbSeq = blockSize / divider;
        size_t const tokenSpace = ZSTD_cwksp_alloc_size(WILDCOPY_OVERLENGTH + blockSize)
                                + ZSTD_cwksp_alloc_size(maxNbSeq * sizeof(seqDef))
                                + 3 * ZSTD_cwksp_alloc_size(maxNbSeq * sizeof(BYTE));
        size_t const buffOutSize = (zbuff==ZSTDb_buffered) ? ZSTD_compressBound(blockSize)+1 : 0;
        size_t const buffInSize = (zbuff==ZSTDb_buffered) ? windowSize + blockSize : 0;
        size_t const matchStateSize = ZSTD_sizeof_matchState(&params.cParams, /* forCCtx */ 1);
        size_t const maxNbLdmSeq = ZSTD_ldm_getMaxNbSeq(params.ldmParams, blockSize);

        ZSTD_indexResetPolicy_e needsIndexReset = zc->initialized ? ZSTDirp_continue : ZSTDirp_reset;

        if (ZSTD_indexTooCloseToMax(zc->blockState.matchState.window)) {
            needsIndexReset = ZSTDirp_reset;
        }

        ZSTD_cwksp_bump_oversized_duration(ws, 0);

        /* Check if workspace is large enough, alloc a new one if needed */
        {   size_t const cctxSpace = zc->staticSize ? ZSTD_cwksp_alloc_size(sizeof(ZSTD_CCtx)) : 0;
            size_t const entropySpace = ZSTD_cwksp_alloc_size(HUF_WORKSPACE_SIZE);
            size_t const blockStateSpace = 2 * ZSTD_cwksp_alloc_size(sizeof(ZSTD_compressedBlockState_t));
            size_t const bufferSpace = ZSTD_cwksp_alloc_size(buffInSize) + ZSTD_cwksp_alloc_size(buffOutSize);
            size_t const ldmSpace = ZSTD_ldm_getTableSize(params.ldmParams);
            size_t const ldmSeqSpace = ZSTD_cwksp_alloc_size(maxNbLdmSeq * sizeof(rawSeq));

            size_t const neededSpace =
                cctxSpace +
                entropySpace +
                blockStateSpace +
                ldmSpace +
                ldmSeqSpace +
                matchStateSize +
                tokenSpace +
                bufferSpace;

            int const workspaceTooSmall = ZSTD_cwksp_sizeof(ws) < neededSpace;
            int const workspaceWasteful = ZSTD_cwksp_check_wasteful(ws, neededSpace);

            DEBUGLOG(4, "Need %zuKB workspace, including %zuKB for match state, and %zuKB for buffers",
                        neededSpace>>10, matchStateSize>>10, bufferSpace>>10);
            DEBUGLOG(4, "windowSize: %zu - blockSize: %zu", windowSize, blockSize);

            if (workspaceTooSmall || workspaceWasteful) {
                DEBUGLOG(4, "Resize workspaceSize from %zuKB to %zuKB",
                            ZSTD_cwksp_sizeof(ws) >> 10,
                            neededSpace >> 10);

                RETURN_ERROR_IF(zc->staticSize, memory_allocation, "static cctx : no resize");

                needsIndexReset = ZSTDirp_reset;

                ZSTD_cwksp_free(ws, zc->customMem);
                FORWARD_IF_ERROR(ZSTD_cwksp_create(ws, neededSpace, zc->customMem));

                DEBUGLOG(5, "reserving object space");
                /* Statically sized space.
                 * entropyWorkspace never moves,
                 * though prev/next block swap places */
                assert(ZSTD_cwksp_check_available(ws, 2 * sizeof(ZSTD_compressedBlockState_t)));
                zc->blockState.prevCBlock = (ZSTD_compressedBlockState_t*) ZSTD_cwksp_reserve_object(ws, sizeof(ZSTD_compressedBlockState_t));
                RETURN_ERROR_IF(zc->blockState.prevCBlock == NULL, memory_allocation, "couldn't allocate prevCBlock");
                zc->blockState.nextCBlock = (ZSTD_compressedBlockState_t*) ZSTD_cwksp_reserve_object(ws, sizeof(ZSTD_compressedBlockState_t));
                RETURN_ERROR_IF(zc->blockState.nextCBlock == NULL, memory_allocation, "couldn't allocate nextCBlock");
                zc->entropyWorkspace = (U32*) ZSTD_cwksp_reserve_object(ws, HUF_WORKSPACE_SIZE);
                RETURN_ERROR_IF(zc->blockState.nextCBlock == NULL, memory_allocation, "couldn't allocate entropyWorkspace");
        }   }

        ZSTD_cwksp_clear(ws);

        /* init params */
        zc->appliedParams = params;
        zc->blockState.matchState.cParams = params.cParams;
        zc->pledgedSrcSizePlusOne = pledgedSrcSize+1;
        zc->consumedSrcSize = 0;
        zc->producedCSize = 0;
        if (pledgedSrcSize == ZSTD_CONTENTSIZE_UNKNOWN)
            zc->appliedParams.fParams.contentSizeFlag = 0;
        DEBUGLOG(4, "pledged content size : %u ; flag : %u",
            (unsigned)pledgedSrcSize, zc->appliedParams.fParams.contentSizeFlag);
        zc->blockSize = blockSize;

        XXH64_reset(&zc->xxhState, 0);
        zc->stage = ZSTDcs_init;
        zc->dictID = 0;

        ZSTD_reset_compressedBlockState(zc->blockState.prevCBlock);

        /* ZSTD_wildcopy() is used to copy into the literals buffer,
         * so we have to oversize the buffer by WILDCOPY_OVERLENGTH bytes.
         */
        zc->seqStore.litStart = ZSTD_cwksp_reserve_buffer(ws, blockSize + WILDCOPY_OVERLENGTH);
        zc->seqStore.maxNbLit = blockSize;

        /* buffers */
        zc->inBuffSize = buffInSize;
        zc->inBuff = (char*)ZSTD_cwksp_reserve_buffer(ws, buffInSize);
        zc->outBuffSize = buffOutSize;
        zc->outBuff = (char*)ZSTD_cwksp_reserve_buffer(ws, buffOutSize);

        /* ldm bucketOffsets table */
        if (params.ldmParams.enableLdm) {
            /* TODO: avoid memset? */
            size_t const ldmBucketSize =
                  ((size_t)1) << (params.ldmParams.hashLog -
                                  params.ldmParams.bucketSizeLog);
            zc->ldmState.bucketOffsets = ZSTD_cwksp_reserve_buffer(ws, ldmBucketSize);
            memset(zc->ldmState.bucketOffsets, 0, ldmBucketSize);
        }

        /* sequences storage */
        ZSTD_referenceExternalSequences(zc, NULL, 0);
        zc->seqStore.maxNbSeq = maxNbSeq;
        zc->seqStore.llCode = ZSTD_cwksp_reserve_buffer(ws, maxNbSeq * sizeof(BYTE));
        zc->seqStore.mlCode = ZSTD_cwksp_reserve_buffer(ws, maxNbSeq * sizeof(BYTE));
        zc->seqStore.ofCode = ZSTD_cwksp_reserve_buffer(ws, maxNbSeq * sizeof(BYTE));
        zc->seqStore.sequencesStart = (seqDef*)ZSTD_cwksp_reserve_aligned(ws, maxNbSeq * sizeof(seqDef));

        FORWARD_IF_ERROR(ZSTD_reset_matchState(
            &zc->blockState.matchState,
            ws,
            &params.cParams,
            crp,
            needsIndexReset,
            ZSTD_resetTarget_CCtx));

        /* ldm hash table */
        if (params.ldmParams.enableLdm) {
            /* TODO: avoid memset? */
            size_t const ldmHSize = ((size_t)1) << params.ldmParams.hashLog;
            zc->ldmState.hashTable = (ldmEntry_t*)ZSTD_cwksp_reserve_aligned(ws, ldmHSize * sizeof(ldmEntry_t));
            memset(zc->ldmState.hashTable, 0, ldmHSize * sizeof(ldmEntry_t));
            zc->ldmSequences = (rawSeq*)ZSTD_cwksp_reserve_aligned(ws, maxNbLdmSeq * sizeof(rawSeq));
            zc->maxNbLdmSequences = maxNbLdmSeq;

            ZSTD_window_init(&zc->ldmState.window);
            ZSTD_window_clear(&zc->ldmState.window);
        }

        DEBUGLOG(3, "wksp: finished allocating, %zd bytes remain available", ZSTD_cwksp_available_space(ws));
        zc->initialized = 1;

        return 0;
    }
}